

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# simdjson.h
# Opt level: O0

char * simdjson::internal::allocate_padded_buffer(size_t length)

{
  ulong uVar1;
  char *padded_buffer;
  size_t totalpaddedlength;
  size_t length_local;
  
  uVar1 = length + 0x20;
  if (uVar1 < length) {
    length_local = 0;
  }
  else {
    length_local = (size_t)operator_new__(uVar1,(nothrow_t *)&std::nothrow);
    if ((void *)length_local == (void *)0x0) {
      length_local = 0;
    }
    else {
      memset((void *)(length_local + length),0,uVar1 - length);
    }
  }
  return (char *)length_local;
}

Assistant:

inline char *allocate_padded_buffer(size_t length) noexcept {
  const size_t totalpaddedlength = length + SIMDJSON_PADDING;
  if(totalpaddedlength<length) {
    // overflow
    return nullptr;
  }
#ifdef FUZZING_BUILD_MODE_UNSAFE_FOR_PRODUCTION
  // avoid getting out of memory
  if (totalpaddedlength>(1UL<<20)) {
    return nullptr;
  }
#endif

  char *padded_buffer = new (std::nothrow) char[totalpaddedlength];
  if (padded_buffer == nullptr) {
    return nullptr;
  }
  // We write zeroes in the padded region to avoid having uninitized
  // garbage. If nothing else, garbage getting read might trigger a
  // warning in a memory checking.
  std::memset(padded_buffer + length, 0, totalpaddedlength - length);
  return padded_buffer;
}